

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Performance::anon_unknown_0::ObjectData::ObjectData
          (ObjectData *this,ProgramSources *shader_,Geometry *geometry_)

{
  glu::ProgramSources::ProgramSources(&this->shader,shader_);
  std::vector<float,_std::allocator<float>_>::vector(&this->geometry,geometry_);
  return;
}

Assistant:

ObjectData (const ProgramSources& shader_, const Geometry& geometry_) : shader(shader_), geometry(geometry_) {}